

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O3

void pztopology::TPZPrism::MapToSide<double>
               (int side,TPZVec<double> *InternalPar,TPZVec<double> *SidePar,
               TPZFMatrix<double> *JacToSide)

{
  bool bVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_24;
  
  local_24 = side;
  GetTolerance();
  pdVar3 = InternalPar->fStore;
  dVar6 = *pdVar3;
  dVar5 = pdVar3[1];
  dVar4 = pdVar3[2];
  bVar1 = CheckProjectionForSingularity<double>(&local_24,InternalPar);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Side projection is not regular and it should have been checked earlier. Aborting..",
               0x52);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzprism.cpp"
               ,0x428);
  }
  switch(local_24) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    (*SidePar->_vptr_TPZVec[3])(SidePar,0);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,0,0);
    break;
  case 6:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar5 = dVar5 + -1.0;
    *SidePar->fStore = -1.0 - (dVar6 + dVar6) / dVar5;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = -2.0 / dVar5;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = (dVar6 + dVar6) / (dVar5 * dVar5);
    goto LAB_00db54ef;
  case 7:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar4 = dVar6 + dVar5;
    *SidePar->fStore = (dVar5 + dVar5) / dVar4 + -1.0;
    dVar4 = dVar4 * dVar4;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = (dVar5 * -2.0) / dVar4;
    goto LAB_00db4e75;
  case 8:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar4 = dVar6 + -1.0;
    *SidePar->fStore = (dVar5 + dVar5) / dVar4 + 1.0;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = (dVar5 * -2.0) / (dVar4 * dVar4);
    goto LAB_00db54a8;
  case 9:
  case 10:
  case 0xb:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    *SidePar->fStore = dVar4;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = 0.0;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = 0.0;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2] = 1.0;
    break;
  case 0xc:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar5 = 1.0 - dVar5;
    *SidePar->fStore = (dVar6 + dVar6) / dVar5 + -1.0;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = 2.0 / dVar5;
    dVar4 = dVar5 * dVar5;
LAB_00db4e75:
    dVar4 = (dVar6 + dVar6) / dVar4;
LAB_00db5059:
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = dVar4;
LAB_00db54ef:
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2] = 0.0;
    break;
  case 0xd:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar4 = dVar6 + dVar5;
    *SidePar->fStore = (dVar5 + dVar5) / dVar4 + -1.0;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = (dVar5 * -2.0) / (dVar4 * dVar4);
    dVar4 = (dVar6 + dVar6) / (dVar4 * dVar4);
    goto LAB_00db5059;
  case 0xe:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar4 = dVar6 + -1.0;
    *SidePar->fStore = (dVar5 + dVar5) / dVar4 + 1.0;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = (dVar5 * -2.0) / (dVar4 * dVar4);
LAB_00db54a8:
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = 2.0 / (dVar6 + -1.0);
    goto LAB_00db54ef;
  case 0xf:
  case 0x13:
    (*SidePar->_vptr_TPZVec[3])(SidePar,2);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,2,3);
    pdVar3 = SidePar->fStore;
    *pdVar3 = dVar6;
    pdVar3[1] = dVar5;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = 1.0;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = 0.0;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2] = 0.0;
    if ((lVar2 < 2) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[1] = 0.0;
    if ((lVar2 < 2) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 + 1] = 1.0;
    if ((lVar2 < 2) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2 + 1] = 0.0;
    break;
  case 0x10:
    (*SidePar->_vptr_TPZVec[3])(SidePar,2);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,2,3);
    dVar5 = dVar5 + -1.0;
    pdVar3 = SidePar->fStore;
    *pdVar3 = -1.0 - (dVar6 + dVar6) / dVar5;
    pdVar3[1] = dVar4;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = -2.0 / dVar5;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = (dVar6 + dVar6) / (dVar5 * dVar5);
    goto LAB_00db564a;
  case 0x11:
    (*SidePar->_vptr_TPZVec[3])(SidePar,2);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,2,3);
    dVar7 = dVar6 + dVar5;
    pdVar3 = SidePar->fStore;
    *pdVar3 = (dVar5 + dVar5) / dVar7 + -1.0;
    pdVar3[1] = dVar4;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = (dVar5 * -2.0) / (dVar7 * dVar7);
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = (dVar6 + dVar6) / (dVar7 * dVar7);
    goto LAB_00db564a;
  case 0x12:
    (*SidePar->_vptr_TPZVec[3])(SidePar,2);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,2,3);
    dVar6 = dVar6 + -1.0;
    pdVar3 = SidePar->fStore;
    *pdVar3 = -1.0 - (dVar5 + dVar5) / dVar6;
    pdVar3[1] = dVar4;
    lVar2 = (JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3 = JacToSide->fElem;
    *pdVar3 = (dVar5 + dVar5) / (dVar6 * dVar6);
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2] = -2.0 / dVar6;
LAB_00db564a:
    if ((lVar2 < 1) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2] = 0.0;
    if ((lVar2 < 2) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[1] = 0.0;
    if ((lVar2 < 2) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 + 1] = 0.0;
    if ((lVar2 < 2) || ((JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 2 + 1] = 1.0;
    break;
  case 0x14:
    TPZVec<double>::operator=(SidePar,InternalPar);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,3,3);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0x29])(JacToSide);
  }
  if (local_24 < 0x15) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Cant compute MapToSide method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n"
             ,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "This should have been caught earlier in the execution, there is something wrong.\n",
             0x51);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Check method TPZTetrahedron::CheckProjectionForSingularity<T>\n"
             ,0x3e);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzprism.cpp"
             ,0x4da);
}

Assistant:

void TPZPrism::MapToSide(int side, TPZVec<T> &InternalPar, TPZVec<T> &SidePar, TPZFMatrix<T> &JacToSide) {
        double zero = pztopology::GetTolerance();

        T qsi = InternalPar[0];
        T eta = InternalPar[1];
        T zeta = InternalPar[2];

        if(!CheckProjectionForSingularity(side,InternalPar)){
            std::cout<<"Side projection is not regular and it should have been checked earlier. Aborting.."<<std::endl;
            DebugStop();
        }
        switch(side)
        {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            {
                SidePar.Resize(0); JacToSide.Resize(0,0);
                break;
            }
            case 6://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = -1 + eta;
                    SidePar[0] = -1 - (2*qsi)/den;
                    JacToSide(0,0) = -2/den;
                    JacToSide(0,1) = (2*qsi)/(den*den);
                    JacToSide(0,2) = 0;
                }
                break;

            case 7://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = eta + qsi;
                    SidePar[0] = -1 + (2*eta)/den;
                    JacToSide(0,0) = (-2*eta)/(den*den);
                    JacToSide(0,1) = (2*qsi)/(den*den);
                    JacToSide(0,2) = 0;
                }
                break;

            case 8://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = -1 + qsi;
                    SidePar[0] = 1 + (2*eta)/den;
                    JacToSide(0,0) = (-2*eta)/(den*den);
                    JacToSide(0,1) = 2/den;
                    JacToSide(0,2) = 0;
                }
                break;

            case 9://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                SidePar[0] = zeta;
                JacToSide(0,0) = 0;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 1;
                break;

            case 10://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                SidePar[0] = zeta;
                JacToSide(0,0) = 0;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 1;
                break;

            case 11://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                SidePar[0] = zeta;
                JacToSide(0,0) = 0;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 1;
                break;

            case 12://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = 1 - eta;
                    SidePar[0] = -1 +(2*qsi)/den;
                    JacToSide(0,0) = 2/den;
                    JacToSide(0,1) = (2*qsi)/(den*den);
                    JacToSide(0,2) = 0;
                }
                break;

            case 13://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    SidePar[0] = -1 + (2*eta)/(eta + qsi);
                    JacToSide(0,0) = (-2*eta)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,1) = (2*qsi)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,2) = 0;
                }
                break;

            case 14://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    SidePar[0] = 1 + (2*eta)/(-1 + qsi);
                    JacToSide(0,0) = (-2*eta)/((-1 + qsi)*(-1 + qsi));
                    JacToSide(0,1) = 2/(-1 + qsi);
                    JacToSide(0,2) = 0;
                }
                break;

            case 15://2D - triangle
                SidePar.Resize(2); JacToSide.Resize(2,3);
                SidePar[0] = qsi;
                SidePar[1] = eta;
                JacToSide(0,0) = 1;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 0;
                JacToSide(1,0) = 0;
                JacToSide(1,1) = 1;
                JacToSide(1,2) = 0;
                break;

            case 16://2D - quadrilateral
                SidePar.Resize(2); JacToSide.Resize(2,3);
                {
                    SidePar[0] = -1 - (2*qsi)/(-1 + eta);
                    SidePar[1] = zeta;
                    JacToSide(0,0) = -2/(-1 + eta);
                    JacToSide(0,1) = (2*qsi)/((-1 + eta)*(-1 + eta));
                    JacToSide(0,2) = 0;
                    JacToSide(1,0) = 0;
                    JacToSide(1,1) = 0;
                    JacToSide(1,2) = 1;
                }
                break;

            case 17://2D - quadrilateral
                SidePar.Resize(2); JacToSide.Resize(2,3);
                {
                    SidePar[0] = -1 + (2*eta)/(eta + qsi);
                    SidePar[1] = zeta;
                    JacToSide(0,0) = (-2*eta)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,1) = (2*qsi)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,2) = 0;
                    JacToSide(1,0) = 0;
                    JacToSide(1,1) = 0;
                    JacToSide(1,2) = 1;
                }
                break;

            case 18://2D - quadrilateral
                SidePar.Resize(2); JacToSide.Resize(2,3);
                {
                    SidePar[0] = -1 - (2*eta)/(-1 + qsi);
                    SidePar[1] = zeta;
                    JacToSide(0,0) = (2*eta)/((-1 + qsi)*(-1 + qsi));
                    JacToSide(0,1) = -2/(-1 + qsi);
                    JacToSide(0,2) = 0;
                    JacToSide(1,0) = 0;
                    JacToSide(1,1) = 0;
                    JacToSide(1,2) = 1;
                }
                break;

            case 19://2D - triangle
                SidePar.Resize(2); JacToSide.Resize(2,3);
                SidePar[0] = qsi;
                SidePar[1] = eta;
                JacToSide(0,0) = 1;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 0;
                JacToSide(1,0) = 0;
                JacToSide(1,1) = 1;
                JacToSide(1,2) = 0;
                break;
            case 20:
                SidePar = InternalPar;
                JacToSide.Resize(3, 3);
                JacToSide.Identity();
                break;
        }
        if(side > 20)
        {
            cout << "Cant compute MapToSide method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n";
            cout << "This should have been caught earlier in the execution, there is something wrong.\n";
            cout << "Check method TPZTetrahedron::CheckProjectionForSingularity<T>\n";
            DebugStop();
        }
    }